

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dothrow.c
# Opt level: O0

void hitfloor(obj *obj,obj *ostack,boolean thrown)

{
  boolean bVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  boolean thrown_local;
  obj *ostack_local;
  obj *obj_local;
  
  if ((((level->locations[u.ux][u.uy].typ == '%') || (level->locations[u.ux][u.uy].typ == '&')) ||
      (('\x10' < level->locations[u.ux][u.uy].typ && (level->locations[u.ux][u.uy].typ < '\x15'))))
     || ((level->locations[u.ux][u.uy].typ == '#' || (((byte)u._1052_1_ >> 1 & 1) != 0)))) {
    dropy(obj);
  }
  else {
    if (level->locations[u.ux][u.uy].typ == '!') {
      doaltarobj(obj);
    }
    else {
      pcVar3 = Doname2(obj);
      pcVar4 = "";
      if (obj->quan == 1) {
        pcVar4 = "s";
      }
      pcVar5 = surface((int)u.ux,(int)u.uy);
      pline("%s hit%s the %s.",pcVar3,pcVar4,pcVar5);
    }
    bVar1 = detonate_obj(obj,ostack,uwep,(int)u.ux,(int)u.uy,thrown);
    if ((((bVar1 == '\0') && (iVar2 = hero_breaks(obj,u.ux,u.uy,'\x01'), iVar2 == 0)) &&
        (bVar1 = ship_object(obj,u.ux,u.uy,'\0'), bVar1 == '\0')) &&
       (dropy(obj), (u._1052_1_ & 1) == 0)) {
      container_impact_dmg(obj);
    }
  }
  return;
}

Assistant:

void hitfloor(struct obj *obj, struct obj *ostack, boolean thrown)
{
	if (IS_SOFT(level->locations[u.ux][u.uy].typ) || u.uinwater) {
		dropy(obj);
		return;
	}
	if (IS_ALTAR(level->locations[u.ux][u.uy].typ))
		doaltarobj(obj);
	else
		pline("%s hit%s the %s.", Doname2(obj),
		      (obj->quan == 1L) ? "s" : "", surface(u.ux,u.uy));

	if (detonate_obj(obj, ostack, uwep, u.ux, u.uy, thrown))
	    return;

	if (hero_breaks(obj, u.ux, u.uy, TRUE)) return;
	if (ship_object(obj, u.ux, u.uy, FALSE)) return;
	dropy(obj);
	if (!u.uswallow) container_impact_dmg(obj);
}